

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replicode_common.h
# Opt level: O2

P<r_exec::TDecompiler> * __thiscall
core::P<r_exec::TDecompiler>::operator=(P<r_exec::TDecompiler> *this,TDecompiler *c)

{
  atomic_int_fast64_t *paVar1;
  TDecompiler *this_00;
  
  this_00 = (TDecompiler *)this->object;
  if (this_00 != c) {
    if (this_00 != (TDecompiler *)0x0) {
      _Object::decRef((_Object *)this_00);
    }
    this->object = &c->super__Object;
    if (c != (TDecompiler *)0x0) {
      LOCK();
      paVar1 = &(c->super__Object).refCount;
      (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
      UNLOCK();
    }
  }
  return this;
}

Assistant:

P<C> &operator =(C *c)
    {
        if (object == c) {
            return *this;
        }

        if (object) {
            object->decRef();
        }

        object = c;

        if (object) {
            object->incRef();
        }

        return *this;
    }